

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcreat.c
# Opt level: O2

MATRIX mat_fill(MATRIX A,int type)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  if ((uint)type < 2) {
    uVar1 = (ulong)*(uint *)(A + -1);
    if ((int)*(uint *)(A + -1) < 1) {
      uVar1 = 0;
    }
    for (uVar2 = 0; uVar2 != uVar1; uVar2 = uVar2 + 1) {
      uVar3 = (ulong)*(uint *)((long)A + -4);
      if ((int)*(uint *)((long)A + -4) < 1) {
        uVar3 = 0;
      }
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        uVar5 = 0x3ff00000;
        if (uVar2 != uVar4) {
          uVar5 = 0;
        }
        if (type != 1) {
          uVar5 = 0;
        }
        A[uVar2][uVar4] = (double)((ulong)uVar5 << 0x20);
      }
    }
  }
  return A;
}

Assistant:

MATRIX mat_fill( MATRIX A, int type )
{
	int	i, j;

	switch (type)
		{
		case UNDEFINED:
			break;
		case ZERO_MATRIX:
		case UNIT_MATRIX:
			for (i=0; i<MatRow(A); i++)
			for (j=0; j<MatCol(A); j++)
				{
				if (type == UNIT_MATRIX)
					{
					if (i==j)
						{
						A[i][j] = 1.0;
						continue;
						}
					}
				A[i][j] = 0.0;
				}
			break;
		}
	return (A);
}